

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O1

int __thiscall FileBuffer::getBufferPosition(FileBuffer *this,int position)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint segment;
  uint uVar5;
  ulong uVar6;
  uint loadToPosition;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint loadToPosition_00;
  uint loadToPosition_01;
  bool bVar10;
  
  iVar1 = this->_fileSegmentLength;
  segment = position / iVar1;
  uVar6 = (long)position % (long)iVar1 & 0xffffffff;
  uVar5 = (uint)((long)position % (long)iVar1);
  uVar7 = (ulong)this->_segments;
  bVar10 = 0 < (long)uVar7;
  if ((long)uVar7 < 1) {
    loadToPosition_00 = 0xffffffff;
    loadToPosition_01 = 0xffffffff;
    loadToPosition = 0xffffffff;
  }
  else {
    piVar3 = this->_loadedSegments;
    loadToPosition = 0xffffffff;
    uVar9 = 0;
    loadToPosition_01 = 0xffffffff;
    loadToPosition_00 = 0xffffffff;
    do {
      uVar5 = (uint)uVar6;
      uVar2 = piVar3[uVar9];
      uVar8 = (uint)uVar9;
      uVar4 = uVar8;
      if ((uVar2 & loadToPosition_00) != 0xffffffff) {
        uVar4 = loadToPosition_00;
      }
      loadToPosition_00 = uVar4;
      if ((loadToPosition_01 == 0xffffffff) || ((int)uVar2 < piVar3[(int)loadToPosition_01])) {
        loadToPosition_01 = uVar8;
      }
      if ((loadToPosition == 0xffffffff) || (piVar3[(int)loadToPosition] < (int)uVar2)) {
        loadToPosition = uVar8;
      }
      if (uVar2 == segment) break;
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < uVar7;
      uVar5 = uVar5 + iVar1;
      uVar6 = (ulong)uVar5;
    } while (uVar7 != uVar9);
  }
  if (!bVar10) {
    if (loadToPosition_00 == 0xffffffff) {
      if (this->_loadedSegments[(int)loadToPosition] < (int)segment) {
        loadSegment(this,segment,loadToPosition_01);
        uVar5 = position % this->_fileSegmentLength + loadToPosition_01 * this->_fileSegmentLength;
      }
      else if ((int)segment < this->_loadedSegments[(int)loadToPosition_01]) {
        loadSegment(this,segment,loadToPosition);
        uVar5 = position % this->_fileSegmentLength + loadToPosition * this->_fileSegmentLength;
      }
      else {
        puts(
            "Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?"
            );
        uVar5 = 0xffffffff;
      }
    }
    else {
      loadSegment(this,segment,loadToPosition_00);
      uVar5 = position % this->_fileSegmentLength + loadToPosition_00 * this->_fileSegmentLength;
    }
  }
  return uVar5;
}

Assistant:

int FileBuffer::getBufferPosition(int position) {
    int segment = getSegmentNumber(position);

    int firstFreeSegment = -1;
    int lowestSegment = -1;
    int highestSegment = -1;

    for (int i = 0; i < _segments; i++) {
        // get first free segment
        if (_loadedSegments[i] == -1 && firstFreeSegment == -1) {
            firstFreeSegment = i;
        }

        // get lowest segment
        if (lowestSegment == -1 || _loadedSegments[i] < _loadedSegments[lowestSegment]) {
            lowestSegment = i;
        }

        // get highest segment
        if (highestSegment == -1 || _loadedSegments[i] > _loadedSegments[highestSegment]) {
            highestSegment = i;
        }

        // Segment already loaded, so just take it
        if (_loadedSegments[i] == segment) {
            return (i * _fileSegmentLength) + (position % _fileSegmentLength);
        }
    }

    //Segment not yet loaded:

    // take a free segment slot, if one is found
    if (firstFreeSegment != -1) {
        loadSegment(segment, firstFreeSegment);
        return (firstFreeSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the lowest segment slot, if segment number is higher than all loaded segments
    if (segment > _loadedSegments[highestSegment]) {
        loadSegment(segment, lowestSegment);
        return (lowestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the highest segment slot, if segment number is lower than all loaded segments
    if (segment < _loadedSegments[lowestSegment]) {
        loadSegment(segment, highestSegment);
        return (highestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    printf("Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?\n");
    return -1;
}